

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-coroutine-test.c++
# Opt level: O2

Promise<unsigned_long> __thiscall
kj::_::
NullableValue<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-coroutine-test.c++:520:10)>
::
anon_union_8_1_a8c68091_for_NullableValue<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-coroutine-test.c++:520:10)>_2
::anon_class_8_1_54a39809_for_value::operator()
          (anon_class_8_1_54a39809_for_value *this,Timer *timer)

{
  Coroutine<unsigned_long> *this_00;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *this_01;
  SourceLocation location;
  bool bVar1;
  coroutine_handle<void> handle;
  long *in_RDX;
  PromiseAwaiter<void> *__return_storage_ptr__;
  
  handle._M_fr_ptr = operator_new(0x410);
  *(code **)handle._M_fr_ptr = operator();
  *(code **)((long)handle._M_fr_ptr + 8) = operator();
  this_00 = (Coroutine<unsigned_long> *)((long)handle._M_fr_ptr + 0x10);
  *(Timer **)((long)handle._M_fr_ptr + 0x400) = timer;
  location.function = "operator()";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-coroutine-test.c++"
  ;
  location.lineNumber = 0x208;
  location.columnNumber = 10;
  Coroutine<unsigned_long>::Coroutine(this_00,handle,location);
  Coroutine<unsigned_long>::get_return_object((Coroutine<unsigned_long> *)this);
  this_01 = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)((long)handle._M_fr_ptr + 0x3f8);
  (**(code **)(*in_RDX + 0x10))(this_01);
  __return_storage_ptr__ = (PromiseAwaiter<void> *)((long)handle._M_fr_ptr + 0x240);
  co_await<void>(__return_storage_ptr__,(Promise<void> *)this_01);
  *(undefined1 *)((long)handle._M_fr_ptr + 0x408) = 0;
  bVar1 = PromiseAwaiterBase::awaitSuspendImpl
                    ((PromiseAwaiterBase *)__return_storage_ptr__,(CoroutineBase *)this_00);
  if (!bVar1) {
    PromiseAwaiter<void>::await_resume(__return_storage_ptr__);
    PromiseAwaiter<void>::~PromiseAwaiter(__return_storage_ptr__);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(this_01);
    CoroutineMixin<kj::_::Coroutine<unsigned_long>,_unsigned_long>::return_value
              ((CoroutineMixin<kj::_::Coroutine<unsigned_long>,_unsigned_long> *)this_00,
               **(unsigned_long **)((long)handle._M_fr_ptr + 0x400));
    *(undefined8 *)handle._M_fr_ptr = 0;
    *(undefined1 *)((long)handle._M_fr_ptr + 0x408) = 1;
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

auto makeDelayedIntegerFunctor(size_t i) {
  return [i](kj::Timer& timer) -> kj::Promise<size_t> {
    co_await timer.afterDelay(1 * kj::MILLISECONDS);
    co_return i;
  };
}